

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3177f3::Handlers::Handlers
          (Handlers *this,bool partial,shared_ptr<QPDFJob::Config> *c_main)

{
  shared_ptr<QPDFJob::Config> *c_main_local;
  bool partial_local;
  Handlers *this_local;
  
  std::vector<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>::vector
            (&this->json_handlers);
  this->partial = partial;
  this->jh = (JSONHandler *)0x0;
  std::shared_ptr<QPDFJob::Config>::shared_ptr(&this->c_main,c_main);
  std::shared_ptr<QPDFJob::CopyAttConfig>::shared_ptr(&this->c_copy_att);
  std::shared_ptr<QPDFJob::AttConfig>::shared_ptr(&this->c_att);
  std::shared_ptr<QPDFJob::PagesConfig>::shared_ptr(&this->c_pages);
  std::shared_ptr<QPDFJob::UOConfig>::shared_ptr(&this->c_uo);
  std::shared_ptr<QPDFJob::EncConfig>::shared_ptr(&this->c_enc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->accumulated_args);
  initHandlers(this);
  return;
}

Assistant:

Handlers::Handlers(bool partial, std::shared_ptr<QPDFJob::Config> c_main) :
    partial(partial),
    c_main(c_main)
{
    initHandlers();
}